

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

int ma_strncat_s(char *dst,size_t dstSizeInBytes,char *src,size_t count)

{
  bool bVar1;
  char *dstorig;
  size_t count_local;
  char *src_local;
  size_t dstSizeInBytes_local;
  char *dst_local;
  int local_4;
  
  if (dst == (char *)0x0) {
    local_4 = 0x16;
  }
  else if (dstSizeInBytes == 0) {
    local_4 = 0x22;
  }
  else {
    dstSizeInBytes_local = dstSizeInBytes;
    dst_local = dst;
    if (src == (char *)0x0) {
      local_4 = 0x16;
    }
    else {
      while( true ) {
        bVar1 = false;
        if (dstSizeInBytes_local != 0) {
          bVar1 = *dst_local != '\0';
        }
        if (!bVar1) break;
        dst_local = dst_local + 1;
        dstSizeInBytes_local = dstSizeInBytes_local - 1;
      }
      if (dstSizeInBytes_local == 0) {
        local_4 = 0x16;
      }
      else {
        count_local = count;
        src_local = src;
        if (count == 0xffffffffffffffff) {
          count_local = dstSizeInBytes_local - 1;
        }
        while( true ) {
          bVar1 = false;
          if ((dstSizeInBytes_local != 0) && (bVar1 = false, *src_local != '\0')) {
            bVar1 = count_local != 0;
          }
          if (!bVar1) break;
          *dst_local = *src_local;
          dstSizeInBytes_local = dstSizeInBytes_local - 1;
          count_local = count_local - 1;
          src_local = src_local + 1;
          dst_local = dst_local + 1;
        }
        if (dstSizeInBytes_local == 0) {
          *dst = '\0';
          local_4 = 0x22;
        }
        else {
          *dst_local = '\0';
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

MA_API MA_NO_INLINE int ma_strncat_s(char* dst, size_t dstSizeInBytes, const char* src, size_t count)
{
    char* dstorig;

    if (dst == 0) {
        return 22;
    }
    if (dstSizeInBytes == 0) {
        return 34;
    }
    if (src == 0) {
        return 22;
    }

    dstorig = dst;

    while (dstSizeInBytes > 0 && dst[0] != '\0') {
        dst += 1;
        dstSizeInBytes -= 1;
    }

    if (dstSizeInBytes == 0) {
        return 22;  /* Unterminated. */
    }


    if (count == ((size_t)-1)) {        /* _TRUNCATE */
        count = dstSizeInBytes - 1;
    }

    while (dstSizeInBytes > 0 && src[0] != '\0' && count > 0) {
        *dst++ = *src++;
        dstSizeInBytes -= 1;
        count -= 1;
    }

    if (dstSizeInBytes > 0) {
        dst[0] = '\0';
    } else {
        dstorig[0] = '\0';
        return 34;
    }

    return 0;
}